

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O1

void __thiscall
flatbuffers::lobster::LobsterGenerator::StructBuilderArgs
          (LobsterGenerator *this,StructDef *struct_def,char *nameprefix,string *code_ptr)

{
  FieldDef *name;
  StructDef *struct_def_00;
  char *pcVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  pointer ppFVar10;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  LobsterGenerator *local_d0;
  string local_c8;
  string local_a8;
  string *local_88;
  char *local_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  StructDef *local_58;
  string local_50;
  
  ppFVar10 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar10 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_d0 = this;
    local_88 = code_ptr;
    local_80 = nameprefix;
    local_58 = struct_def;
    do {
      name = *ppFVar10;
      if (((name->value).type.base_type == BASE_TYPE_STRUCT) &&
         (((name->value).type.struct_def)->fixed == true)) {
        struct_def_00 = (name->value).type.struct_def;
        EscapeKeyword(&local_c8,local_d0,(string *)name);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
        pcVar1 = local_80;
        local_110 = &local_100;
        puVar4 = (ulong *)(plVar2 + 2);
        if ((ulong *)*plVar2 == puVar4) {
          local_100 = *puVar4;
          lStack_f8 = plVar2[3];
        }
        else {
          local_100 = *puVar4;
          local_110 = (ulong *)*plVar2;
        }
        local_108 = plVar2[1];
        *plVar2 = (long)puVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        strlen(local_80);
        plVar2 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_110,0,(char *)0x0,(ulong)pcVar1);
        plVar5 = plVar2 + 2;
        if ((long *)*plVar2 == plVar5) {
          local_e0 = *plVar5;
          lStack_d8 = plVar2[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *plVar5;
          local_f0 = (long *)*plVar2;
        }
        local_e8 = plVar2[1];
        *plVar2 = (long)plVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        StructBuilderArgs(local_d0,struct_def_00,(char *)local_f0,local_88);
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_110 != &local_100) {
          operator_delete(local_110,local_100 + 1);
        }
        uVar8 = local_c8.field_2._M_allocated_capacity;
        _Var9._M_p = local_c8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
LAB_002a7897:
          operator_delete(_Var9._M_p,uVar8 + 1);
        }
      }
      else {
        EscapeKeyword(&local_50,local_d0,(string *)name);
        pcVar1 = local_80;
        strlen(local_80);
        plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)pcVar1)
        ;
        local_78 = &local_68;
        plVar5 = plVar2 + 2;
        if ((long *)*plVar2 == plVar5) {
          local_68 = *plVar5;
          lStack_60 = plVar2[3];
        }
        else {
          local_68 = *plVar5;
          local_78 = (long *)*plVar2;
        }
        local_70 = plVar2[1];
        *plVar2 = (long)plVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x375f8e);
        psVar6 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_c8.field_2._M_allocated_capacity = *psVar6;
          local_c8.field_2._8_8_ = plVar2[3];
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar6;
          local_c8._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_c8._M_string_length = plVar2[1];
        *plVar2 = (long)psVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_110 = &local_100;
        puVar4 = (ulong *)(plVar2 + 2);
        if ((ulong *)*plVar2 == puVar4) {
          local_100 = *puVar4;
          lStack_f8 = plVar2[3];
        }
        else {
          local_100 = *puVar4;
          local_110 = (ulong *)*plVar2;
        }
        local_108 = plVar2[1];
        *plVar2 = (long)puVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        LobsterType_abi_cxx11_(&local_a8,local_d0,&(name->value).type);
        uVar7 = 0xf;
        if (local_110 != &local_100) {
          uVar7 = local_100;
        }
        if (uVar7 < local_a8._M_string_length + local_108) {
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            uVar8 = local_a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar8 < local_a8._M_string_length + local_108) goto LAB_002a7687;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_110);
        }
        else {
LAB_002a7687:
          puVar3 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_110,(ulong)local_a8._M_dataplus._M_p);
        }
        plVar2 = puVar3 + 2;
        if ((long *)*puVar3 == plVar2) {
          local_e0 = *plVar2;
          lStack_d8 = puVar3[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *plVar2;
          local_f0 = (long *)*puVar3;
        }
        local_e8 = puVar3[1];
        *puVar3 = plVar2;
        puVar3[1] = 0;
        *(undefined1 *)plVar2 = 0;
        std::__cxx11::string::_M_append((char *)local_88,(ulong)local_f0);
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (local_110 != &local_100) {
          operator_delete(local_110,local_100 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        uVar8 = local_50.field_2._M_allocated_capacity;
        _Var9._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_002a7897;
      }
      ppFVar10 = ppFVar10 + 1;
    } while (ppFVar10 !=
             (local_58->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void StructBuilderArgs(const StructDef &struct_def, const char *nameprefix,
                         std::string *code_ptr) {
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (IsStruct(field.value.type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        StructBuilderArgs(*field.value.type.struct_def,
                          (nameprefix + (NormalizedName(field) + "_")).c_str(),
                          code_ptr);
      } else {
        std::string &code = *code_ptr;
        code += ", " + (nameprefix + NormalizedName(field)) + ":" +
                LobsterType(field.value.type);
      }
    }
  }